

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

void Mpm_ManPerform(Mpm_Man_t *p)

{
  if (p->pPars->fMap4Cnf == 0) {
    p->pCutCmp = Mpm_CutCompareDelay;
    Mpm_ManPerformRound(p);
    if (p->pPars->fOneRound != 0) {
      return;
    }
    p->pCutCmp = Mpm_CutCompareDelay2;
    Mpm_ManPerformRound(p);
    p->pCutCmp = Mpm_CutCompareArea;
    Mpm_ManPerformRound(p);
    p->fMainRun = 1;
    p->pCutCmp = Mpm_CutCompareArea;
    Mpm_ManComputeEstRefs(p);
    Mpm_ManPerformRound(p);
    p->pCutCmp = Mpm_CutCompareArea2;
    Mpm_ManComputeEstRefs(p);
  }
  else {
    p->pCutCmp = Mpm_CutCompareArea;
  }
  Mpm_ManPerformRound(p);
  return;
}

Assistant:

void Mpm_ManPerform( Mpm_Man_t * p )
{
    if ( p->pPars->fMap4Cnf )
    {
        p->pCutCmp = Mpm_CutCompareArea;
        Mpm_ManPerformRound( p );   
    }
    else
    {
        p->pCutCmp = Mpm_CutCompareDelay;
        Mpm_ManPerformRound( p );
        if ( p->pPars->fOneRound )
            return;
    
        p->pCutCmp = Mpm_CutCompareDelay2;
        Mpm_ManPerformRound( p );
    
        p->pCutCmp = Mpm_CutCompareArea;
        Mpm_ManPerformRound( p );   

        p->fMainRun = 1;

        p->pCutCmp = Mpm_CutCompareArea;
        Mpm_ManComputeEstRefs( p );
        Mpm_ManPerformRound( p );

        p->pCutCmp = Mpm_CutCompareArea2;
        Mpm_ManComputeEstRefs( p );
        Mpm_ManPerformRound( p );
    }
}